

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  pointer *pppcVar1;
  cmMakefile *pcVar2;
  cmGeneratorTarget *headTarget;
  cmLocalUnixMakefileGenerator3 *lg;
  Snapshot snapshot;
  bool bVar3;
  char *pcVar4;
  cmCompiledGeneratorExpression *this_00;
  cmCustomCommand *cc;
  reference source;
  string *psVar5;
  reference ppcVar6;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_348;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_340;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_338;
  const_iterator si_2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_310;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_308;
  const_iterator si_1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_298;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_290;
  const_iterator o;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  cmCustomCommandGenerator ccg;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_218;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_210;
  const_iterator si;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  undefined1 local_1e8 [6];
  bool clean;
  char *local_1c8;
  char *clean_no_custom;
  string local_1b8;
  string local_198;
  undefined1 local_178 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  Snapshot local_138;
  cmListFileBacktrace local_120;
  undefined1 local_e0 [8];
  cmGeneratorExpression ge;
  string local_98;
  char *local_78;
  char *additional_clean_files;
  allocator local_59;
  string local_58;
  string local_38;
  string *local_18;
  string *config;
  cmMakefileTargetGenerator *this_local;
  
  pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
  config = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"CMAKE_BUILD_TYPE",&local_59);
  pcVar4 = cmMakefile::GetSafeDefinition(pcVar2,&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,pcVar4,(allocator *)((long)&additional_clean_files + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&additional_clean_files + 3));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_18 = &local_38;
  pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"ADDITIONAL_MAKE_CLEAN_FILES",
             (allocator *)((long)&ge.Backtrace.Snapshot.Position.Position + 7));
  pcVar4 = cmMakefile::GetProperty(pcVar2,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&ge.Backtrace.Snapshot.Position.Position + 7));
  local_78 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    cmState::Snapshot::Snapshot(&local_138,(cmState *)0x0);
    cmCommandContext::cmCommandContext((cmCommandContext *)&cge);
    snapshot.Position.Tree = local_138.Position.Tree;
    snapshot.State = local_138.State;
    snapshot.Position.Position = local_138.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_120,snapshot,(cmCommandContext *)&cge);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_e0,&local_120);
    cmListFileBacktrace::~cmListFileBacktrace(&local_120);
    cmCommandContext::~cmCommandContext((cmCommandContext *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_178,local_e0);
    local_178._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_178);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_178 + 0x10),
               (auto_ptr_ref<cmCompiledGeneratorExpression>)local_178._8_8_);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_178);
    this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                        ((auto_ptr<cmCompiledGeneratorExpression> *)(local_178 + 0x10));
    psVar5 = local_18;
    headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_1b8);
    pcVar4 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,(cmLocalGenerator *)lg,psVar5,false,headTarget,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_1b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_198,pcVar4,(allocator *)((long)&clean_no_custom + 7));
    cmSystemTools::ExpandListArgument(&local_198,&this->CleanFiles,false);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)((long)&clean_no_custom + 7));
    std::__cxx11::string::~string((string *)&local_1b8);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_178 + 0x10));
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_e0);
  }
  pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1e8,"CLEAN_NO_CUSTOM",
             (allocator *)
             ((long)&customCommands.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar4 = cmMakefile::GetProperty(pcVar2,(string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&customCommands.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1c8 = pcVar4;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = cmSystemTools::IsOff(pcVar4);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si);
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si,local_18);
  local_218._M_current =
       (cmSourceFile **)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si);
  __gnu_cxx::
  __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
  ::__normal_iterator<cmSourceFile_const**>
            ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
              *)&local_210,&local_218);
  while( true ) {
    ccg.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                             &si);
    bVar3 = __gnu_cxx::operator!=
                      (&local_210,
                       (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                        *)&ccg.Depends.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) break;
    ppcVar6 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&local_210);
    cc = cmSourceFile::GetCustomCommand(*ppcVar6);
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)&outputs,cc,
               &(this->super_cmCommonTargetGenerator).ConfigName,
               (cmLocalGenerator *)this->LocalGenerator);
    GenerateCustomRuleFile(this,(cmCustomCommandGenerator *)&outputs);
    if ((customCommands.
         super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      o._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                               ((cmCustomCommandGenerator *)&outputs);
      local_290._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)o._M_current);
      while( true ) {
        local_298._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(o._M_current);
        bVar3 = __gnu_cxx::operator!=(&local_290,&local_298);
        if (!bVar3) break;
        source = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_290);
        cmCommonTargetGenerator::Convert
                  ((string *)
                   &headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   &this->super_cmCommonTargetGenerator,source,START_OUTPUT,UNCHANGED);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->CleanFiles,
                    (value_type *)
                    &headerSources.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_290);
      }
    }
    cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&outputs);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&local_210);
  }
  pppcVar1 = &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar1);
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar1,
             local_18);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  pppcVar1 = &externalObjects.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar1);
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar1,
             local_18);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &externalObjects.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si_1);
  cmGeneratorTarget::GetExternalObjects
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si_1,local_18);
  local_310._M_current =
       (cmSourceFile **)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si_1);
  __gnu_cxx::
  __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
  ::__normal_iterator<cmSourceFile_const**>
            ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
              *)&local_308,&local_310);
  while( true ) {
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                             &si_1);
    bVar3 = __gnu_cxx::operator!=
                      (&local_308,
                       (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                        *)&objectSources.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) break;
    ppcVar6 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&local_308);
    psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->ExternalObjects,psVar5);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&local_308);
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si_2);
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si_2,local_18);
  local_340._M_current =
       (cmSourceFile **)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si_2);
  __gnu_cxx::
  __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
  ::__normal_iterator<cmSourceFile_const**>
            ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
              *)&local_338,&local_340);
  while( true ) {
    local_348._M_current =
         (cmSourceFile **)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si_2);
    bVar3 = __gnu_cxx::operator!=(&local_338,&local_348);
    if (!bVar3) break;
    ppcVar6 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&local_338);
    WriteObjectRuleFiles(this,*ppcVar6);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&local_338);
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si_2);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si_1);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &externalObjects.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // write the custom commands for this target
  // Look for files registered for cleaning in this directory.
  if(const char* additional_clean_files =
     this->Makefile->GetProperty
     ("ADDITIONAL_MAKE_CLEAN_FILES"))
    {
    cmGeneratorExpression ge;
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
                                            ge.Parse(additional_clean_files);

    cmSystemTools::ExpandListArgument(cge->Evaluate(this->LocalGenerator,
                                                    config,
                                                    false,
                                                    this->GeneratorTarget,
                                                    0, 0),
                                      this->CleanFiles);
    }

  // add custom commands to the clean rules?
  const char* clean_no_custom =
    this->Makefile->GetProperty("CLEAN_NO_CUSTOM");
  bool clean = cmSystemTools::IsOff(clean_no_custom);

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands, config);
  for(std::vector<cmSourceFile const*>::const_iterator
        si = customCommands.begin();
      si != customCommands.end(); ++si)
    {
    cmCustomCommandGenerator ccg(*(*si)->GetCustomCommand(),
                                 this->ConfigName,
                                 this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean)
      {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for(std::vector<std::string>::const_iterator o = outputs.begin();
          o != outputs.end(); ++o)
        {
        this->CleanFiles.push_back
          (this->Convert(*o,
                         cmLocalGenerator::START_OUTPUT,
                         cmLocalGenerator::UNCHANGED));
        }
      }
    }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources,
    this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources,
    this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects, config);
  for(std::vector<cmSourceFile const*>::const_iterator
        si = externalObjects.begin();
      si != externalObjects.end(); ++si)
    {
    this->ExternalObjects.push_back((*si)->GetFullPath());
    }
  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources, config);
  for(std::vector<cmSourceFile const*>::const_iterator
        si = objectSources.begin(); si != objectSources.end(); ++si)
    {
    // Generate this object file's rule file.
    this->WriteObjectRuleFiles(**si);
    }
}